

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall xatlas::internal::BitImage::get(BitImage *this,uint32_t x,uint32_t y)

{
  unsigned_long *puVar1;
  bool bVar2;
  uint32_t index;
  uint32_t y_local;
  uint32_t x_local;
  BitImage *this_local;
  
  bVar2 = false;
  if (x < this->m_width) {
    bVar2 = y < this->m_height;
  }
  if (!bVar2) {
    __assert_fail("x < m_width && y < m_height",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x580,"bool xatlas::internal::BitImage::get(uint32_t, uint32_t) const");
  }
  puVar1 = Array<unsigned_long>::operator[](&this->m_data,(x >> 6) + y * this->m_rowStride);
  return (*puVar1 & 1L << ((byte)x & 0x3f)) != 0;
}

Assistant:

bool get(uint32_t x, uint32_t y) const
	{
		XA_DEBUG_ASSERT(x < m_width && y < m_height);
		const uint32_t index = (x >> 6) + y * m_rowStride;
		return (m_data[index] & (UINT64_C(1) << (uint64_t(x) & UINT64_C(63)))) != 0;
	}